

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

void PrintBuiltInType(FLispString *out,EZCCBuiltinType type)

{
  int iVar1;
  size_t len;
  char buf [30];
  EZCCBuiltinType type_local;
  FLispString *out_local;
  
  unique0x10000073 = type;
  if (type < ZCC_NUM_BUILT_IN_TYPES) {
    FLispString::Add(out,BuiltInTypeNames[type]);
  }
  else {
    iVar1 = mysnprintf((char *)&len,0x1e,"bad-type-%u",(ulong)type);
    FLispString::Add(out,(char *)&len,(long)iVar1);
  }
  return;
}

Assistant:

static void PrintBuiltInType(FLispString &out, EZCCBuiltinType type)
{
	assert(ZCC_NUM_BUILT_IN_TYPES == countof(BuiltInTypeNames));
	if (unsigned(type) >= unsigned(ZCC_NUM_BUILT_IN_TYPES))
	{
		char buf[30];
		size_t len = mysnprintf(buf, countof(buf), "bad-type-%u", type);
		out.Add(buf, len);
	}
	else
	{
		out.Add(BuiltInTypeNames[type]);
	}
}